

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O3

iterator __thiscall
fmt::v5::
printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
operator()(printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
           *this,wchar_t *value)

{
  format_specs *pfVar1;
  size_t in_RCX;
  void *in_RDX;
  int __fd;
  
  if (value == (wchar_t *)0x0) {
    pfVar1 = (this->
             super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
             ).specs_;
    if ((pfVar1->super_core_format_specs).type == 'p') {
      (pfVar1->super_core_format_specs).type = '\0';
      __fd = 0x2064e4;
    }
    else {
      __fd = 0x206494;
    }
    internal::
    arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
    write(&this->
           super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
          ,__fd,in_RDX,in_RCX);
  }
  else {
    internal::
    arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
    operator()(&this->
                super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
               ,value);
  }
  return (iterator)
         (this->
         super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
         ).writer_.out_.container;
}

Assistant:

iterator operator()(const wchar_t *value) {
    if (value)
      base::operator()(value);
    else if (this->spec()->type == 'p')
      write_null_pointer(char_type());
    else
      this->write(L"(null)");
    return this->out();
  }